

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O3

int Sbl_ManTestSat(Sbl_Man_t *p,int iPivot)

{
  Hsh_VecMan_t *pHVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  lit *plVar4;
  ulong uVar5;
  ABC_INT64_T AVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int *piVar10;
  Vec_Int_t *pVVar11;
  abctime aVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  uint *puVar16;
  Vec_Int_t *pVVar17;
  uint uVar18;
  ulong uVar20;
  sat_solver *s;
  char *__format;
  Sbl_Man_t *p_00;
  int iVar21;
  ulong uVar22;
  long lVar23;
  timespec ts;
  undefined8 in_stack_ffffffffffffff58;
  undefined4 uVar24;
  timespec local_98;
  uint local_84;
  long local_80;
  Vec_Int_t *local_78;
  uint local_6c;
  uint local_68;
  int local_64;
  size_t local_60;
  uint local_58;
  int local_54;
  int local_50;
  uint local_4c;
  Sbl_Man_t *local_48;
  long local_40;
  Vec_Int_t *local_38;
  ulong uVar19;
  
  iVar7 = clock_gettime(3,&local_98);
  if (iVar7 < 0) {
    lVar15 = 1;
  }
  else {
    lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_98.tv_nsec),8);
    lVar15 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) + local_98.tv_sec * -1000000;
  }
  iVar7 = p->pHash->vMap->nSize;
  p->nTried = p->nTried + 1;
  Sbl_ManClean(p);
  iVar8 = Sbl_ManWindow2(p,iPivot);
  if (iVar8 == 0) {
    if (p->fVeryVerbose != 0) {
      printf("Obj %d: Window with less than %d nodes does not exist.\n",iPivot,(ulong)(uint)p->nVars
            );
    }
    p->nSmallWins = p->nSmallWins + 1;
  }
  else {
    local_78 = p->vAnds;
    pHVar1 = p->pHash;
    pVVar11 = pHVar1->vTable;
    pVVar17 = pHVar1->vMap;
    uVar13 = pVVar17->nSize;
    local_68 = iPivot;
    local_48 = p;
    local_40 = lVar15;
    if (pVVar11->nSize < (int)uVar13) {
      uVar20 = (ulong)(pVVar11->nSize * 2 - 1);
      while( true ) {
        do {
          uVar13 = (uint)uVar20;
          uVar18 = uVar13 + 1;
          uVar19 = (ulong)uVar18;
          uVar14 = uVar20 & 1;
          uVar20 = uVar19;
        } while (uVar14 != 0);
        if (uVar18 < 9) break;
        iVar8 = 5;
        while (uVar18 % (iVar8 - 2U) != 0) {
          uVar9 = iVar8 * iVar8;
          iVar8 = iVar8 + 2;
          if (uVar18 < uVar9) goto LAB_007b0c28;
        }
      }
LAB_007b0c28:
      if (pVVar11->nCap < (int)uVar18) {
        if (pVVar11->pArray == (int *)0x0) {
          piVar10 = (int *)malloc((long)(int)uVar18 << 2);
        }
        else {
          piVar10 = (int *)realloc(pVVar11->pArray,(long)(int)uVar18 << 2);
        }
        pVVar11->pArray = piVar10;
        if (piVar10 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        pVVar11->nCap = uVar18;
      }
      if (uVar13 < 0x7fffffff) {
        memset(pVVar11->pArray,0xff,uVar19 << 2);
      }
      pVVar11->nSize = uVar18;
      pVVar11 = pHVar1->vTable;
      pVVar17 = pHVar1->vMap;
      uVar13 = pVVar17->nSize;
      if (0 < (int)uVar13) {
        pVVar2 = pHVar1->vData;
        piVar10 = pVVar17->pArray;
        lVar15 = 0;
        do {
          iVar8 = piVar10[lVar15];
          if (((long)iVar8 < 0) || (pVVar2->nSize <= iVar8)) goto LAB_007b1abe;
          piVar10 = pVVar2->pArray + iVar8;
          iVar8 = *piVar10;
          (pHVar1->vTemp).nCap = iVar8;
          (pHVar1->vTemp).nSize = iVar8;
          (pHVar1->vTemp).pArray = piVar10 + 2;
          if ((long)iVar8 < 1) {
            uVar13 = 0;
          }
          else {
            uVar20 = 0;
            uVar13 = 0;
            do {
              uVar13 = uVar13 + (&Hsh_VecManHash_s_Primes)[uVar20 % 7] * (piVar10 + 2)[uVar20];
              uVar20 = uVar20 + 1;
            } while ((long)iVar8 != uVar20);
          }
          uVar20 = (ulong)uVar13 % (ulong)(uint)pVVar11->nSize;
          if (((int)uVar20 < 0) || (pVVar11->nSize <= (int)uVar20)) goto LAB_007b1abe;
          if (pVVar17->nSize <= lVar15) goto LAB_007b1add;
          piVar10 = pVVar17->pArray;
          iVar8 = piVar10[lVar15];
          if (((long)iVar8 < 0) || (pVVar2->nSize <= iVar8)) goto LAB_007b1abe;
          piVar3 = pVVar11->pArray;
          pVVar2->pArray[(long)iVar8 + 1] = piVar3[uVar20];
          piVar3[uVar20] = (int)lVar15;
          lVar15 = lVar15 + 1;
          uVar13 = pVVar17->nSize;
        } while (lVar15 < (int)uVar13);
      }
    }
    iVar8 = local_78->nSize;
    uVar20 = (ulong)iVar8;
    if ((long)uVar20 < 1) {
      uVar18 = 0;
    }
    else {
      uVar14 = 0;
      uVar18 = 0;
      do {
        uVar18 = uVar18 + (&Hsh_VecManHash_s_Primes)[uVar14 % 7] * local_78->pArray[uVar14];
        uVar14 = uVar14 + 1;
      } while (uVar20 != uVar14);
    }
    local_80 = CONCAT44(local_80._4_4_,iVar7);
    uVar14 = (ulong)uVar18 % (ulong)(uint)pVVar11->nSize;
    iVar7 = (int)uVar14;
    if ((iVar7 < 0) || (pVVar11->nSize <= iVar7)) {
LAB_007b1abe:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    puVar16 = (uint *)(pVVar11->pArray + uVar14);
    uVar18 = *puVar16;
    pVVar11 = pHVar1->vData;
    if (uVar18 != 0xffffffff) {
      local_60 = uVar20 << 2;
      do {
        if (((int)uVar18 < 0) || ((int)uVar13 <= (int)uVar18)) goto LAB_007b1add;
        iVar7 = pVVar17->pArray[uVar18];
        if (((long)iVar7 < 0) || (pVVar11->nSize <= iVar7)) goto LAB_007b1abe;
        if (pVVar11->pArray == (int *)0x0) break;
        piVar10 = pVVar11->pArray + iVar7;
        if ((*piVar10 == iVar8) && (iVar7 = bcmp(piVar10 + 2,local_78->pArray,local_60), iVar7 == 0)
           ) goto LAB_007b0f12;
        uVar18 = piVar10[1];
        puVar16 = (uint *)(piVar10 + 1);
      } while (uVar18 != 0xffffffff);
    }
    *puVar16 = uVar13;
    if ((pVVar11->nSize & 1U) != 0) {
      __assert_fail("Vec_IntSize(p->vData) % 2 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecHsh.h"
                    ,0x216,"int Hsh_VecManAdd(Hsh_VecMan_t *, Vec_Int_t *)");
    }
    Vec_IntPush(pVVar17,pVVar11->nSize);
    pVVar11 = local_78;
    Vec_IntPush(pHVar1->vData,local_78->nSize);
    Vec_IntPush(pHVar1->vData,-1);
    uVar20 = (ulong)(uint)pVVar11->nSize;
    if (0 < pVVar11->nSize) {
      lVar15 = 0;
      do {
        Vec_IntPush(pHVar1->vData,pVVar11->pArray[lVar15]);
        lVar15 = lVar15 + 1;
        uVar20 = (ulong)pVVar11->nSize;
      } while (lVar15 < (long)uVar20);
    }
    if ((uVar20 & 1) != 0) {
      Vec_IntPush(pHVar1->vData,-1);
    }
LAB_007b0f12:
    p_00 = local_48;
    uVar13 = local_68;
    if ((int)local_80 == local_48->pHash->vMap->nSize) {
      if (local_48->fVeryVerbose != 0) {
        printf("Obj %d: This window was already tried.\n",(ulong)local_68);
      }
      p_00->nHashWins = p_00->nHashWins + 1;
    }
    else {
      if (local_48->fVeryVerbose != 0) {
        printf("\nObj = %6d : Leaf = %2d.  AND = %2d.  Root = %2d.    LUT = %2d.\n",(ulong)local_68,
               (ulong)(uint)local_48->vLeaves->nSize,(ulong)(uint)local_48->vAnds->nSize);
      }
      uVar18 = p_00->vLeaves->nSize;
      if (((int)uVar18 < 0x81) && (iVar7 = p_00->vAnds->nSize, iVar7 <= p_00->nVars)) {
        if (iVar7 < 10) {
          if (p_00->fVeryVerbose == 0) {
            return 0;
          }
          puts("Skipping.");
          return 0;
        }
        Sbl_ManComputeCuts(p_00);
        Sbl_ManCreateCnf(p_00);
        if (p_00->fVeryVeryVerbose != 0) {
          uVar18 = sat_solver_nclauses(p_00->pSat);
          uVar13 = p_00->vAnds->nSize;
          iVar7 = p_00->vCutsI1->nSize;
          sat_solver_nclauses(p_00->pSat);
          printf("All clauses = %d.  Multi clauses = %d.  Binary clauses = %d.  Other clauses = %d.\n\n"
                 ,(ulong)uVar18,(ulong)uVar13,(ulong)(iVar7 - uVar13));
        }
        pVVar11 = p_00->vAssump;
        pVVar11->nSize = 0;
        Vec_IntPush(pVVar11,-1);
        iVar7 = p_00->vAnds->nSize;
        if (iVar7 < p_00->Power2) {
          iVar8 = iVar7 * 2 + 1;
          iVar21 = iVar7;
          do {
            if (iVar7 < 0) goto LAB_007b1b3a;
            Vec_IntPush(p_00->vAssump,iVar8);
            iVar21 = iVar21 + 1;
            iVar8 = iVar8 + 2;
          } while (iVar21 < p_00->Power2);
        }
        pVVar11 = p_00->vRootVars;
        if (0 < pVVar11->nSize) {
          lVar15 = 0;
          do {
            if (pVVar11->pArray[lVar15] < 0) goto LAB_007b1b3a;
            Vec_IntPush(p_00->vAssump,pVVar11->pArray[lVar15] * 2);
            lVar15 = lVar15 + 1;
            pVVar11 = p_00->vRootVars;
          } while (lVar15 < pVVar11->nSize);
        }
        local_50 = p_00->vSolInit->nSize + 1;
        iVar7 = 1;
        local_84 = 0;
        local_6c = 0;
        do {
          uVar24 = (undefined4)((ulong)in_stack_ffffffffffffff58 >> 0x20);
          if ((iVar7 == 0) || (uVar13 = local_50 - iVar7, (int)uVar13 < 1)) goto LAB_007b19b2;
          if (p_00->fVeryVerbose != 0) {
            printf("Trying to find mapping with %d LUTs.\n",(ulong)uVar13);
          }
          if (p_00->vCardVars->nSize <= (int)uVar13) {
LAB_007b1add:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar8 = p_00->vCardVars->pArray[uVar13];
          if (iVar8 < 0) {
LAB_007b1b3a:
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          if (p_00->vAssump->nSize < 1) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          *p_00->vAssump->pArray = iVar8 * 2 + 1;
          local_54 = iVar7;
          iVar7 = clock_gettime(3,&local_98);
          lVar15 = -1;
          local_80 = -1;
          if (-1 < iVar7) {
            local_80 = local_98.tv_nsec / 1000 + local_98.tv_sec * 1000000;
          }
          AVar6 = (p_00->pSat->stats).conflicts;
          plVar4 = p_00->vAssump->pArray;
          in_stack_ffffffffffffff58 = 0;
          iVar7 = sat_solver_solve(p_00->pSat,plVar4,plVar4 + p_00->vAssump->nSize,
                                   (long)p_00->nBTLimit,0,0,0);
          iVar8 = clock_gettime(3,&local_98);
          if (-1 < iVar8) {
            lVar15 = local_98.tv_nsec / 1000 + local_98.tv_sec * 1000000;
          }
          p_00->timeSat = p_00->timeSat + (lVar15 - local_80);
          uVar13 = (int)(p_00->pSat->stats).conflicts - (int)AVar6;
          local_6c = local_6c + uVar13;
          local_84 = local_84 + 1;
          p_00->nRuns = p_00->nRuns + 1;
          local_64 = iVar7;
          if (iVar7 == 1) {
            iVar7 = clock_gettime(3,&local_98);
            if (iVar7 < 0) {
              lVar15 = -1;
            }
            else {
              lVar15 = local_98.tv_nsec / 1000 + local_98.tv_sec * 1000000;
            }
            p_00->timeSatSat = p_00->timeSatSat + (lVar15 - local_80);
            local_58 = uVar13;
            if (p_00->fVeryVeryVerbose != 0) {
              if (0 < p_00->vAnds->nSize) {
                lVar15 = 0;
                do {
                  if (p_00->pSat->size <= lVar15) goto LAB_007b1afc;
                  printf("%d",(ulong)(p_00->pSat->model[lVar15] == 1));
                  lVar15 = lVar15 + 1;
                } while (lVar15 < p_00->vAnds->nSize);
              }
              putchar(10);
              pVVar11 = p_00->vAnds;
              if (pVVar11->nSize < 1) {
                uVar13 = 0;
              }
              else {
                uVar20 = 0;
                uVar13 = 0;
                do {
                  if ((long)p_00->pSat->size <= (long)uVar20) goto LAB_007b1afc;
                  if (p_00->pSat->model[uVar20] == 1) {
                    printf("%d=%d ",uVar20 & 0xffffffff,1);
                    uVar13 = uVar13 + 1;
                    pVVar11 = p_00->vAnds;
                  }
                  uVar20 = uVar20 + 1;
                } while ((long)uVar20 < (long)pVVar11->nSize);
              }
              printf("Count = %d\n",(ulong)uVar13);
            }
            p_00->vSolCur->nSize = 0;
            uVar13 = p_00->FirstVar;
            pVVar11 = (Vec_Int_t *)(ulong)uVar13;
            iVar7 = sat_solver_nvars(p_00->pSat);
            iVar8 = 0;
            if ((int)uVar13 < iVar7) {
              uVar13 = 1;
              iVar8 = 0;
              pVVar17 = pVVar11;
              local_38 = pVVar11;
              do {
                if ((int)pVVar17 < 0) {
LAB_007b1afc:
                  __assert_fail("v >= 0 && v < s->size",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                                ,0xda,"int sat_solver_var_value(sat_solver *, int)");
                }
                s = p_00->pSat;
                if (s->size <= (int)pVVar11) goto LAB_007b1afc;
                if (s->model[(long)pVVar11] == 1) {
                  local_78 = pVVar11;
                  if (p_00->fVeryVeryVerbose != 0) {
                    uVar18 = (int)pVVar11 - p_00->FirstVar;
                    if (((int)uVar18 < 0) || (p_00->vCutsObj->nSize <= (int)uVar18))
                    goto LAB_007b1add;
                    iVar7 = p_00->vCutsObj->pArray[uVar18];
                    lVar15 = (long)iVar7;
                    if ((lVar15 < 0) || (p_00->vAnds->nSize <= iVar7)) goto LAB_007b1add;
                    uVar18 = uVar13 + 1;
                    printf("Cut %3d : Node = %3d %6d  ",(ulong)uVar13,lVar15,
                           (ulong)(uint)p_00->vAnds->pArray[lVar15]);
                    uVar13 = uVar18;
                    if (p_00->fVeryVeryVerbose != 0) {
                      uVar13 = (int)local_78 - p_00->FirstVar;
                      if (((((int)uVar13 < 0) || (p_00->vCutsI1->nSize <= (int)uVar13)) ||
                          (p_00->vCutsI2->nSize <= (int)uVar13)) ||
                         (p_00->vCutsN1->nSize <= (int)uVar13)) {
LAB_007b1b1b:
                        __assert_fail("i >= 0 && i < p->nSize",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                                      ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
                      }
                      local_60 = CONCAT44(local_60._4_4_,iVar8);
                      local_4c = uVar18;
                      if (p_00->vCutsN2->nSize <= (int)uVar13) goto LAB_007b1b1b;
                      uVar20 = p_00->vCutsI1->pArray[uVar13];
                      uVar14 = p_00->vCutsI2->pArray[uVar13];
                      uVar19 = p_00->vCutsN1->pArray[uVar13];
                      uVar5 = p_00->vCutsN2->pArray[uVar13];
                      uVar22 = 0;
                      printf("{ ");
                      iVar8 = 0;
                      do {
                        if ((uVar20 >> (uVar22 & 0x3f) & 1) != 0) {
                          printf("i%d ",uVar22 & 0xffffffff);
                          iVar8 = iVar8 + 1;
                        }
                        uVar22 = uVar22 + 1;
                      } while (uVar22 != 0x40);
                      uVar20 = 0;
                      do {
                        if ((uVar14 >> (uVar20 & 0x3f) & 1) != 0) {
                          printf("i%d ",(ulong)((uint)uVar20 | 0x40));
                          iVar8 = iVar8 + 1;
                        }
                        uVar20 = uVar20 + 1;
                      } while (uVar20 != 0x40);
                      putchar(0x20);
                      uVar20 = 0;
                      do {
                        if ((uVar19 >> (uVar20 & 0x3f) & 1) != 0) {
                          printf("n%d ",uVar20 & 0xffffffff);
                          iVar8 = iVar8 + 1;
                        }
                        uVar20 = uVar20 + 1;
                      } while (uVar20 != 0x40);
                      uVar20 = 0;
                      do {
                        if ((uVar5 >> (uVar20 & 0x3f) & 1) != 0) {
                          printf("n%d ",(ulong)((uint)uVar20 | 0x40));
                          iVar8 = iVar8 + 1;
                        }
                        uVar20 = uVar20 + 1;
                      } while (uVar20 != 0x40);
                      puts("};");
                      iVar8 = (int)local_60 + iVar8;
                      pVVar17 = local_38;
                      p_00 = local_48;
                      uVar13 = local_4c;
                    }
                  }
                  Vec_IntPush(p_00->vSolCur,(int)local_78 - p_00->FirstVar);
                  s = p_00->pSat;
                  pVVar11 = local_78;
                }
                pVVar11 = (Vec_Int_t *)((long)&pVVar11->nCap + 1);
                iVar7 = sat_solver_nvars(s);
              } while ((int)pVVar11 < iVar7);
            }
            if ((p_00->fDelay == 0) ||
               (iVar7 = Sbl_ManEvaluateMapping(p_00,p_00->DelayMax), iVar7 != 0)) {
              pVVar11 = p_00->vSolBest;
              pVVar11->nSize = 0;
              pVVar17 = p_00->vSolCur;
              if (0 < pVVar17->nSize) {
                lVar15 = 0;
                do {
                  Vec_IntPush(pVVar11,pVVar17->pArray[lVar15]);
                  lVar15 = lVar15 + 1;
                } while (lVar15 < pVVar17->nSize);
              }
              iVar7 = local_54 + 1;
              uVar13 = local_58;
            }
            else {
              if (p_00->fVeryVerbose != 0) {
                printf("Critical path of length (%d) is detected:   ",
                       (ulong)(uint)p_00->vPath->nSize);
                pVVar11 = p_00->vPath;
                if (0 < pVVar11->nSize) {
                  uVar20 = 0;
                  do {
                    if (pVVar11->pArray[uVar20] < 0) {
                      __assert_fail("Lit >= 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                                    ,0x12f,"int Abc_Lit2Var(int)");
                    }
                    uVar13 = (uint)pVVar11->pArray[uVar20] >> 1;
                    if (p_00->vAnds->nSize <= (int)uVar13) goto LAB_007b1add;
                    printf("%d=%d ",uVar20 & 0xffffffff,(ulong)(uint)p_00->vAnds->pArray[uVar13]);
                    uVar20 = uVar20 + 1;
                    pVVar11 = p_00->vPath;
                  } while ((long)uVar20 < (long)pVVar11->nSize);
                }
                putchar(10);
              }
              plVar4 = p_00->vPath->pArray;
              iVar21 = sat_solver_addclause(p_00->pSat,plVar4,plVar4 + p_00->vPath->nSize);
              iVar7 = local_54;
              uVar13 = local_58;
              if (iVar21 == 0) {
                __assert_fail("value",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                              ,0x452,"int Sbl_ManTestSat(Sbl_Man_t *, int)");
              }
            }
LAB_007b17d3:
            if (p_00->fVeryVerbose != 0) {
              __format = "UNDEC ";
              if (local_64 == 1) {
                __format = "SAT   ";
              }
              if (local_64 == -1) {
                __format = "UNSAT ";
              }
LAB_007b1805:
              local_60 = CONCAT44(local_60._4_4_,iVar8);
              printf(__format);
              printf("confl =%8d.    ",(ulong)uVar13);
              iVar21 = 3;
              iVar8 = clock_gettime(3,&local_98);
              lVar23 = -1;
              lVar15 = -1;
              if (-1 < iVar8) {
                lVar15 = local_98.tv_nsec / 1000 + local_98.tv_sec * 1000000;
              }
              lVar15 = lVar15 - local_80;
              Abc_Print(iVar21,"%s =","Time");
              Abc_Print(iVar21,"%9.2f sec\n",(double)lVar15 / 1000000.0);
              printf("Total ");
              printf("confl =%8d.    ",(ulong)local_6c);
              iVar21 = 3;
              iVar8 = clock_gettime(3,&local_98);
              if (-1 < iVar8) {
                lVar23 = local_98.tv_nsec / 1000 + local_98.tv_sec * 1000000;
              }
              lVar23 = lVar23 + local_40;
              Abc_Print(iVar21,"%s =","Time");
              Abc_Print(iVar21,"%9.2f sec\n",(double)lVar23 / 1000000.0);
              if ((local_64 == 1) && (p_00->fVeryVeryVerbose != 0)) {
                printf("LitCount = %d.\n",local_60 & 0xffffffff);
              }
              putchar(10);
            }
          }
          else {
            if (iVar7 != -1) {
              iVar7 = clock_gettime(3,&local_98);
              uVar24 = (undefined4)((ulong)in_stack_ffffffffffffff58 >> 0x20);
              if (iVar7 < 0) {
                lVar15 = -1;
              }
              else {
                lVar15 = local_98.tv_nsec / 1000 + local_98.tv_sec * 1000000;
              }
              p_00->timeSatUnd = p_00->timeSatUnd + (lVar15 - local_80);
              iVar8 = 0;
              iVar7 = 0;
              if (local_64 != 0) goto LAB_007b17d3;
              goto LAB_007b19b2;
            }
            iVar7 = clock_gettime(3,&local_98);
            if (iVar7 < 0) {
              lVar15 = -1;
            }
            else {
              lVar15 = local_98.tv_nsec / 1000 + local_98.tv_sec * 1000000;
            }
            p_00->timeSatUns = p_00->timeSatUns + (lVar15 - local_80);
            iVar8 = 0;
            __format = "UNSAT ";
            iVar7 = 0;
            if (p_00->fVeryVerbose != 0) goto LAB_007b1805;
          }
          uVar24 = (undefined4)((ulong)in_stack_ffffffffffffff58 >> 0x20);
        } while (local_84 != 10);
        p_00->nIterOuts = p_00->nIterOuts + 1;
        local_84 = 10;
LAB_007b19b2:
        iVar7 = p_00->vSolBest->nSize;
        if ((0 < iVar7) && (iVar7 < p_00->vSolInit->nSize)) {
          Sbl_ManUpdateMapping(p_00);
          if (p_00->pGia->vEdge1 == (Vec_Int_t *)0x0) {
            uVar13 = Sbl_ManCreateTiming(p_00,p_00->DelayMax);
            iVar7 = 0;
          }
          else {
            uVar13 = Gia_ManEvalEdgeDelay(p_00->pGia);
            iVar7 = Gia_ManEvalEdgeCount(p_00->pGia);
          }
          if (p_00->fVerbose != 0) {
            printf("Object %5d : Saved %2d nodes  (Conf =%8d)  Iter =%3d  Delay = %d  Edges = %4d\n"
                   ,(ulong)local_68,(ulong)(uint)(p_00->vSolInit->nSize - p_00->vSolBest->nSize),
                   (ulong)local_6c,(ulong)local_84,(ulong)uVar13,CONCAT44(uVar24,iVar7));
          }
          aVar12 = Abc_Clock();
          p_00->timeTotal = p_00->timeTotal + (aVar12 - p_00->timeStart);
          p_00->nImproved = p_00->nImproved + 1;
          return 2;
        }
        iVar7 = clock_gettime(3,&local_98);
        if (iVar7 < 0) {
          lVar15 = -1;
        }
        else {
          lVar15 = local_98.tv_nsec / 1000 + local_98.tv_sec * 1000000;
        }
        p_00->timeTotal = p_00->timeTotal + (lVar15 - p_00->timeStart);
        return 1;
      }
      if (p_00->fVeryVerbose != 0) {
        printf("Obj %d: Encountered window with %d inputs and %d internal nodes.\n",(ulong)uVar13,
               (ulong)uVar18,(ulong)(uint)p_00->vAnds->nSize);
      }
      p_00->nLargeWins = p_00->nLargeWins + 1;
    }
  }
  return 0;
}

Assistant:

int Sbl_ManTestSat( Sbl_Man_t * p, int iPivot )
{
    int fKeepTrying = 1;
    abctime clk = Abc_Clock(), clk2;
    int i, status, Root, Count, StartSol, nConfTotal = 0, nIters = 0;
    int nEntries = Hsh_VecSize( p->pHash );
    p->nTried++;

    Sbl_ManClean( p );

    // compute one window
    Count = Sbl_ManWindow2( p, iPivot );
    if ( Count == 0 )
    {
        if ( p->fVeryVerbose )
        printf( "Obj %d: Window with less than %d nodes does not exist.\n", iPivot, p->nVars );
        p->nSmallWins++;
        return 0;
    }
    Hsh_VecManAdd( p->pHash, p->vAnds );
    if ( nEntries == Hsh_VecSize(p->pHash) )
    {
        if ( p->fVeryVerbose )
        printf( "Obj %d: This window was already tried.\n", iPivot );
        p->nHashWins++;
        return 0;
    }
    if ( p->fVeryVerbose )
    printf( "\nObj = %6d : Leaf = %2d.  AND = %2d.  Root = %2d.    LUT = %2d.\n", 
        iPivot, Vec_IntSize(p->vLeaves), Vec_IntSize(p->vAnds), Vec_IntSize(p->vRoots), Vec_IntSize(p->vNodes) ); 

    if ( Vec_IntSize(p->vLeaves) > 128 || Vec_IntSize(p->vAnds) > p->nVars )
    {
        if ( p->fVeryVerbose )
        printf( "Obj %d: Encountered window with %d inputs and %d internal nodes.\n", iPivot, Vec_IntSize(p->vLeaves), Vec_IntSize(p->vAnds) );
        p->nLargeWins++;
        return 0;
    }
    if ( Vec_IntSize(p->vAnds) < 10 )
    {
        if ( p->fVeryVerbose )
        printf( "Skipping.\n" );
        return 0;
    }

    // derive cuts
    Sbl_ManComputeCuts( p );
    // derive SAT instance
    Sbl_ManCreateCnf( p );

    if ( p->fVeryVeryVerbose )
    printf( "All clauses = %d.  Multi clauses = %d.  Binary clauses = %d.  Other clauses = %d.\n\n", 
        sat_solver_nclauses(p->pSat), Vec_IntSize(p->vAnds), Vec_WrdSize(p->vCutsI1) - Vec_IntSize(p->vAnds), 
        sat_solver_nclauses(p->pSat) - Vec_WrdSize(p->vCutsI1) );

    // create assumptions
    // cardinality
    Vec_IntClear( p->vAssump );
    Vec_IntPush( p->vAssump, -1 );
    // unused variables
    for ( i = Vec_IntSize(p->vAnds); i < p->Power2; i++ )
        Vec_IntPush( p->vAssump, Abc_Var2Lit(i, 1) );
    // root variables
    Vec_IntForEachEntry( p->vRootVars, Root, i )
        Vec_IntPush( p->vAssump, Abc_Var2Lit(Root, 0) );
//    Vec_IntPrint( p->vAssump );

    StartSol = Vec_IntSize(p->vSolInit) + 1;
//    StartSol = 30;
    while ( fKeepTrying && StartSol-fKeepTrying > 0 )
    {
        int Count = 0, LitCount = 0;
        int nConfBef, nConfAft;
        if ( p->fVeryVerbose )
            printf( "Trying to find mapping with %d LUTs.\n", StartSol-fKeepTrying );
    //    for ( i = Vec_IntSize(p->vSolInit)-5; i < nVars; i++ )
    //        Vec_IntPush( p->vAssump, Abc_Var2Lit(Vec_IntEntry(p->vCardVars, i), 1) );
        Vec_IntWriteEntry( p->vAssump, 0, Abc_Var2Lit(Vec_IntEntry(p->vCardVars, StartSol-fKeepTrying), 1) );
        // solve the problem
        clk2 = Abc_Clock();
        nConfBef = (int)p->pSat->stats.conflicts;
        status = sat_solver_solve( p->pSat, Vec_IntArray(p->vAssump), Vec_IntLimit(p->vAssump), p->nBTLimit, 0, 0, 0 );
        p->timeSat += Abc_Clock() - clk2;
        nConfAft = (int)p->pSat->stats.conflicts;
        nConfTotal += nConfAft - nConfBef;
        nIters++;
        p->nRuns++;
        if ( status == l_True )
            p->timeSatSat += Abc_Clock() - clk2;
        else if ( status == l_False )
            p->timeSatUns += Abc_Clock() - clk2;
        else 
            p->timeSatUnd += Abc_Clock() - clk2;
        if ( status == l_Undef )
            break;
        if ( status == l_True )
        {
            if ( p->fVeryVeryVerbose )
            {
                for ( i = 0; i < Vec_IntSize(p->vAnds); i++ )
                    printf( "%d", sat_solver_var_value(p->pSat, i) );
                printf( "\n" );
                for ( i = 0; i < Vec_IntSize(p->vAnds); i++ )
                    if ( sat_solver_var_value(p->pSat, i) )
                    {
                        printf( "%d=%d ", i, sat_solver_var_value(p->pSat, i) );
                        Count++;
                    }
                printf( "Count = %d\n", Count );
            }
//            for ( i = p->FirstVar; i < sat_solver_nvars(p->pSat); i++ )
//                printf( "%d", sat_solver_var_value(p->pSat, i) );
//            printf( "\n" );
            Count = 1;
            Vec_IntClear( p->vSolCur );
            for ( i = p->FirstVar; i < sat_solver_nvars(p->pSat); i++ )
                if ( sat_solver_var_value(p->pSat, i) )
                {
                    if ( p->fVeryVeryVerbose )
                        printf( "Cut %3d : Node = %3d %6d  ", Count++, Vec_IntEntry(p->vCutsObj, i-p->FirstVar), Vec_IntEntry(p->vAnds, Vec_IntEntry(p->vCutsObj, i-p->FirstVar)) );
                    if ( p->fVeryVeryVerbose )
                        LitCount += Sbl_ManFindAndPrintCut( p, i-p->FirstVar );
                    Vec_IntPush( p->vSolCur, i-p->FirstVar );
                }
            //Vec_IntPrint( p->vRootVars );
            //Vec_IntPrint( p->vRoots );
            //Vec_IntPrint( p->vAnds );
            //Vec_IntPrint( p->vLeaves );
        }

//        fKeepTrying = status == l_True ? fKeepTrying + 1 : 0;
        // check the timing
        if ( status == l_True )
        {
            if ( p->fDelay && !Sbl_ManEvaluateMapping(p, p->DelayMax) )
            {
                int iLit, value;
                if ( p->fVeryVerbose )
                {
                    printf( "Critical path of length (%d) is detected:   ", Vec_IntSize(p->vPath) );
                    Vec_IntForEachEntry( p->vPath, iLit, i )
                        printf( "%d=%d ", i, Vec_IntEntry(p->vAnds, Abc_Lit2Var(iLit)) );
                    printf( "\n" );
                }
                // add the clause
                value = sat_solver_addclause( p->pSat, Vec_IntArray(p->vPath), Vec_IntLimit(p->vPath)  );
                assert( value );
            }
            else
            {
                Vec_IntClear( p->vSolBest );
                Vec_IntAppend( p->vSolBest, p->vSolCur );
                fKeepTrying++;
            }
        }
        else
            fKeepTrying = 0;
        if ( p->fVeryVerbose )
        {
            if ( status == l_False )
                printf( "UNSAT " );
            else if ( status == l_True )
                printf( "SAT   " );
            else 
                printf( "UNDEC " );
            printf( "confl =%8d.    ", nConfAft - nConfBef );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk2 );

            printf( "Total " );
            printf( "confl =%8d.    ", nConfTotal );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            if ( p->fVeryVeryVerbose && status == l_True )
                printf( "LitCount = %d.\n", LitCount );
            printf( "\n" );
        }
        if ( nIters == 10 )
        {
            p->nIterOuts++;
            //printf( "Obj %d : Quitting after %d iterations.\n", iPivot, nIters );
            break;
        }
    }

    // update solution
    if ( Vec_IntSize(p->vSolBest) > 0 && Vec_IntSize(p->vSolBest) < Vec_IntSize(p->vSolInit) )
    {
        int nDelayCur, nEdgesCur = 0;
        Sbl_ManUpdateMapping( p );
        if ( p->pGia->vEdge1 )
        {
            nDelayCur = Gia_ManEvalEdgeDelay( p->pGia );
            nEdgesCur = Gia_ManEvalEdgeCount( p->pGia );
        }
        else
            nDelayCur = Sbl_ManCreateTiming( p, p->DelayMax );
        if ( p->fVerbose )
        printf( "Object %5d : Saved %2d nodes  (Conf =%8d)  Iter =%3d  Delay = %d  Edges = %4d\n", 
            iPivot, Vec_IntSize(p->vSolInit)-Vec_IntSize(p->vSolBest), nConfTotal, nIters, nDelayCur, nEdgesCur );
        p->timeTotal += Abc_Clock() - p->timeStart;
        p->nImproved++;
        return 2;
    }
    else
    {
//        printf( "Object %5d : Saved %2d nodes  (Conf =%8d)  Iter =%3d\n", iPivot, 0, nConfTotal, nIters );
    }
    p->timeTotal += Abc_Clock() - p->timeStart;
    return 1;
}